

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

SDKJsonResult * __thiscall
tonk::SDKSocket::Create(SDKJsonResult *__return_storage_ptr__,SDKSocket *this)

{
  TonkResult TVar1;
  TonkSocketConfig config;
  TonkJson json;
  TonkSocketConfig local_498;
  TonkJson local_420;
  
  if (this->MySocket != (TonkSocket)0x0) {
    if (fp_tonk_socket_destroy != (fp_tonk_socket_destroy_t)0x0) {
      (*fp_tonk_socket_destroy)(this->MySocket,1);
    }
    this->MySocket = (TonkSocket)0x0;
  }
  local_498.WorkerCount = (this->Config).WorkerCount;
  local_498.UDPSendBufferSizeBytes = (this->Config).UDPSendBufferSizeBytes;
  local_498.UDPRecvBufferSizeBytes = (this->Config).UDPRecvBufferSizeBytes;
  local_498.UDPListenPort = (this->Config).UDPListenPort;
  local_498.MaximumClients = (this->Config).MaximumClients;
  local_498.MaximumClientsPerIP = (this->Config).MaximumClientsPerIP;
  local_498.MinuteFloodThresh = (this->Config).MinuteFloodThresh;
  local_498.TimerIntervalUsec = (this->Config).TimerIntervalUsec;
  local_498.NoDataTimeoutUsec = (this->Config).NoDataTimeoutUsec;
  local_498.UDPConnectIntervalUsec = (this->Config).UDPConnectIntervalUsec;
  local_498.ConnectionTimeoutUsec = (this->Config).ConnectionTimeoutUsec;
  local_498._60_4_ = *(undefined4 *)&(this->Config).field_0x3c;
  local_498.InterfaceAddress = (this->Config).InterfaceAddress;
  local_498.BandwidthLimitBPS = (this->Config).BandwidthLimitBPS;
  local_498.Flags = (this->Config).Flags;
  local_498.SendToAppContextPtr = (this->Config).SendToAppContextPtr;
  local_498.SendToHook = (this->Config).SendToHook;
  local_498._4_4_ = SUB84((ulong)*(undefined8 *)&this->Config >> 0x20,0);
  local_498.Version = 9;
  local_498.OnP2PConnectionStart = Create::anon_class_1_0_00000001::__invoke;
  local_498.OnIncomingConnection = Create::anon_class_1_0_00000001::__invoke;
  local_498.OnAdvertisement = Create::anon_class_1_0_00000001::__invoke;
  local_498.AppContextPtr = this;
  TVar1 = tonk_socket_create(&local_498,&this->MySocket,&local_420);
  (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
  (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ErrorJson).field_2;
  (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
  (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
  if (TVar1 != Tonk_Success) {
    (__return_storage_ptr__->super_SDKResult).Result = TVar1;
    strlen(local_420.JsonString);
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->ErrorJson,0,(char *)0x0,(ulong)&local_420);
  }
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Create()
{
    BlockingDestroy();

    TonkSocketConfig config = Config;

    // Override the following members:
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(this);
    config.Version = TONK_VERSION;
    config.OnP2PConnectionStart = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnP2PConnectionStart(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SetSelfReference();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnIncomingConnection = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnIncomingConnection(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnAdvertisement = [](
        TonkAppContextPtr context,
        TonkSocket /*tonkSocket*/,
        const char* ipString,
        uint16_t port,
        uint8_t* data,
        uint32_t bytes)
    {
        SDKSocket* thiz = (SDKSocket*)context;
        thiz->OnAdvertisement(ipString, port, data, bytes);
    };

    TonkJson json;
    TonkResult result = tonk_socket_create(&config, &MySocket, &json);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = json.JsonString;
    }
    return error;
}